

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::HeapType> * __thiscall
wasm::Random::FeatureOptions<wasm::HeapType>::add
          (FeatureOptions<wasm::HeapType> *this,HeapType option)

{
  mapped_type *this_00;
  FeatureSet local_1c;
  FeatureOptions<wasm::HeapType> *local_18;
  FeatureOptions<wasm::HeapType> *this_local;
  HeapType option_local;
  
  local_18 = this;
  this_local = (FeatureOptions<wasm::HeapType> *)option.id;
  FeatureSet::FeatureSet(&local_1c,0);
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
            ::operator[](&this->options,&local_1c);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
            (this_00,(value_type *)&this_local);
  return this;
}

Assistant:

FeatureOptions<T>& add(T option) {
      options[FeatureSet::MVP].push_back(option);
      return *this;
    }